

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

bool __thiscall
chaiscript::Type_Conversions::has_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  byte bVar1;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  _Self in_stack_ffffffffffffffb8;
  Type_Info *in_stack_ffffffffffffffc0;
  Type_Conversions *in_stack_ffffffffffffffc8;
  _Self local_30 [6];
  
  chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex>::
  shared_lock((shared_lock<chaiscript::detail::threading::shared_mutex> *)
              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              (shared_mutex *)in_stack_ffffffffffffff98);
  local_30[0]._M_node =
       (_Base_ptr)
       find_bidir(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8._M_node);
  std::
  set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator!=(local_30,(_Self *)&stack0xffffffffffffffb8);
  chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex>::
  ~shared_lock((shared_lock<chaiscript::detail::threading::shared_mutex> *)0x1ffa7c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool has_conversion(const Type_Info &to, const Type_Info &from) const
      {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        return find_bidir(to, from) != m_conversions.end();
      }